

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_> * __thiscall
kj::Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_>::operator=
          (Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_> *this)

{
  Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_> *this_local;
  
  kj::_::NullableValue<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_>::
  operator=(&this->ptr,(void *)0x0);
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }